

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_deflate_concurrency.cc
# Opt level: O3

void __thiscall Mutator::run(Mutator *this)

{
  long lVar1;
  
  while( true ) {
    do {
      LOCK();
      (this->m_state)._M_i = (this->m_target_state)._M_i;
      UNLOCK();
    } while ((this->m_state)._M_i == PAUSED);
    if ((this->m_state)._M_i == STOPPED) break;
    lVar1 = 0;
    do {
      ::buf[lVar1] = ::buf[lVar1] + '\x01';
      ::buf[lVar1 + 1] = ::buf[lVar1 + 1] + '\x01';
      ::buf[lVar1 + 2] = ::buf[lVar1 + 2] + '\x01';
      ::buf[lVar1 + 3] = ::buf[lVar1 + 3] + '\x01';
      ::buf[lVar1 + 4] = ::buf[lVar1 + 4] + '\x01';
      ::buf[lVar1 + 5] = ::buf[lVar1 + 5] + '\x01';
      ::buf[lVar1 + 6] = ::buf[lVar1 + 6] + '\x01';
      ::buf[lVar1 + 7] = ::buf[lVar1 + 7] + '\x01';
      ::buf[lVar1 + 8] = ::buf[lVar1 + 8] + '\x01';
      ::buf[lVar1 + 9] = ::buf[lVar1 + 9] + '\x01';
      ::buf[lVar1 + 10] = ::buf[lVar1 + 10] + '\x01';
      ::buf[lVar1 + 0xb] = ::buf[lVar1 + 0xb] + '\x01';
      ::buf[lVar1 + 0xc] = ::buf[lVar1 + 0xc] + '\x01';
      ::buf[lVar1 + 0xd] = ::buf[lVar1 + 0xd] + '\x01';
      ::buf[lVar1 + 0xe] = ::buf[lVar1 + 0xe] + '\x01';
      ::buf[lVar1 + 0xf] = ::buf[lVar1 + 0xf] + '\x01';
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x2000);
  }
  return;
}

Assistant:

void run() {
        while (true) {
            m_state.store(m_target_state);
            if (m_state == State::PAUSED)
                continue;
            if (m_state == State::STOPPED)
                break;
            for (uint8_t & i: buf)
                i++;
        }
    }